

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

size_t ggml_graph_nbytes(size_t size,_Bool grads)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  undefined3 in_register_00000031;
  
  sVar2 = ggml_hash_size(size * 2);
  lVar1 = size * 0x10 + 0x50 + sVar2 * 8;
  lVar3 = lVar1 + sVar2 * 0x10;
  if (CONCAT31(in_register_00000031,grads) == 0) {
    lVar3 = lVar1;
  }
  return lVar3 + (sVar2 + 0x1f >> 5) * 4;
}

Assistant:

static size_t ggml_graph_nbytes(size_t size, bool grads) {
    size_t hash_size = ggml_hash_size(size * 2);
    void * p = 0;
    incr_ptr_aligned(&p, sizeof(struct ggml_cgraph), 1);
    incr_ptr_aligned(&p, size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)); // nodes
    incr_ptr_aligned(&p, size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)); // leafs
    incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)); // hash keys
    if (grads) {
        incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)); // grads
        incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)); // grad_accs
    }
    incr_ptr_aligned(&p, ggml_bitset_size(hash_size) * sizeof(ggml_bitset_t), sizeof(ggml_bitset_t));

    size_t nbytes = (size_t) p;
    return nbytes;
}